

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O3

string * __thiscall
cmMakefileTargetGenerator::CreateResponseFile
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this,char *name,string *options
          ,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *makefile_depends)

{
  pointer pcVar1;
  ostream *poVar2;
  string responseFileNameFull;
  cmGeneratedFileStream responseStream;
  value_type local_298;
  cmGeneratedFileStream local_278;
  
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  pcVar1 = (this->TargetBuildDirectoryFull)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_298,pcVar1,pcVar1 + (this->TargetBuildDirectoryFull)._M_string_length)
  ;
  std::__cxx11::string::append((char *)&local_298);
  std::__cxx11::string::append((char *)&local_298);
  cmGeneratedFileStream::cmGeneratedFileStream(&local_278,local_298._M_dataplus._M_p,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent(&local_278,true);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_278,(options->_M_dataplus)._M_p,options->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(makefile_depends,&local_298);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->TargetBuildDirectory)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (this->TargetBuildDirectory)._M_string_length);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefileTargetGenerator::CreateResponseFile(
  const char* name, std::string const& options,
  std::vector<std::string>& makefile_depends)
{
  // Create the response file.
  std::string responseFileNameFull = this->TargetBuildDirectoryFull;
  responseFileNameFull += "/";
  responseFileNameFull += name;
  cmGeneratedFileStream responseStream(responseFileNameFull.c_str());
  responseStream.SetCopyIfDifferent(true);
  responseStream << options << "\n";

  // Add a dependency so the target will rebuild when the set of
  // objects changes.
  makefile_depends.push_back(responseFileNameFull);

  // Construct the name to be used on the command line.
  std::string responseFileName = this->TargetBuildDirectory;
  responseFileName += "/";
  responseFileName += name;
  return responseFileName;
}